

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O2

Lista<int> * __thiscall Lista<int>::operator=(Lista<int> *this,Lista<int> *aCopiar)

{
  uint uVar1;
  Nodo *pNVar2;
  Nat i;
  ulong uVar3;
  int iesimo;
  int local_2c;
  
  eliminarTodos(this);
  uVar1 = longitud(aCopiar);
  i = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = i;
  }
  for (; uVar3 != i; i = i + 1) {
    pNVar2 = iesimoNodo(aCopiar,i);
    local_2c = pNVar2->_valor;
    agregarAtras(this,&local_2c);
  }
  return this;
}

Assistant:

Lista<T>& Lista<T>::operator=(const Lista<T>& aCopiar) {
    this->eliminarTodos();
    int longitud = aCopiar.longitud();
    for(int i = 0; i < longitud; i++) {
        T iesimo = aCopiar.iesimo(i);
        this->agregarAtras(iesimo);
    }
    return *this;
}